

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

get_result * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
          (get_result *__return_storage_ptr__,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  node_type type;
  bool bVar1;
  byte bVar2;
  value_type key_byte;
  uint uVar3;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_00;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_01;
  find_result fVar4;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *child;
  key_prefix_size key_prefix_length;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *key_prefix;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_40;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *local_38;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *leaf;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aStack_28;
  node_type node_type;
  art_key_type remaining_key;
  node_ptr node;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  art_key_type k_local;
  
  bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==(&this->root,(nullptr_t)0x0)
  ;
  if (bVar1) {
    std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::optional
              (__return_storage_ptr__);
  }
  else {
    remaining_key.field_0 =
         (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)(this->root).tagged_ptr;
    aStack_28 = k.field_0;
    while (leaf._7_1_ = detail::basic_node_ptr<unodb::detail::node_header>::type
                                  ((basic_node_ptr<unodb::detail::node_header> *)&remaining_key),
          leaf._7_1_ != LEAF) {
      if (leaf._7_1_ == LEAF) {
        __assert_fail("node_type != node_type::LEAF",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x389,
                      "typename db<Key, Value>::get_result unodb::db<unsigned long, std::span<const std::byte>>::get_internal(art_key_type) const [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      this_00 = &detail::basic_node_ptr<unodb::detail::node_header>::
                 ptr<unodb::detail::inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                           ((basic_node_ptr<unodb::detail::node_header> *)&remaining_key)->
                 super_inode_base<unsigned_long,_std::span<const_std::byte>_>;
      this_01 = detail::
                basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                ::get_key_prefix(this_00);
      bVar2 = detail::
              key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                        *)&this_01->f);
      uVar3 = detail::
              key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                   *)&this_01->f,
                                  (basic_art_key<unsigned_long>)aStack_28.key_bytes._M_elems);
      if (uVar3 < bVar2) {
        std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::optional
                  (__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      detail::basic_art_key<unsigned_long>::shift_right
                ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffd8,(ulong)bVar2);
      type = leaf._7_1_;
      key_byte = detail::basic_art_key<unsigned_long>::operator[]
                           ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffd8,0);
      fVar4 = detail::
              basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::find_child(this_00,type,key_byte);
      if ((in_fake_critical_section *)fVar4.second == (in_fake_critical_section *)0x0) {
        std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::optional
                  (__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      remaining_key.field_0 =
           (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
           in_fake_critical_section::operator_cast_to_basic_node_ptr
                     ((in_fake_critical_section *)fVar4.second);
      detail::basic_art_key<unsigned_long>::shift_right
                ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffd8,1);
    }
    local_38 = detail::basic_node_ptr<unodb::detail::node_header>::
               ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*>
                         ((basic_node_ptr<unodb::detail::node_header> *)&remaining_key);
    local_40 = k.field_0;
    bVar1 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::matches
                      (local_38,(art_key_type)k.field_0);
    if (bVar1) {
      _inode = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::get_value_view
                         (local_38);
      std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::
      optional<std::span<const_std::byte,_18446744073709551615UL>,_true>
                (__return_storage_ptr__,(span<const_std::byte,_18446744073709551615UL> *)&inode);
    }
    else {
      std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::optional
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

typename db<Key, Value>::get_result db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return {};

  auto node{root};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (leaf->matches(k)) return leaf->get_value_view();
      return {};
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    if (key_prefix.get_shared_length(remaining_key) < key_prefix_length)
      return {};
    remaining_key.shift_right(key_prefix_length);
    const auto* const child{
        inode->find_child(node_type, remaining_key[0]).second};
    if (child == nullptr) return {};

    node = *child;
    remaining_key.shift_right(1);
  }
}